

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.cpp
# Opt level: O3

Error __thiscall
asmjit::ZoneVectorBase::_grow(ZoneVectorBase *this,ZoneHeap *heap,size_t sizeOfT,size_t n)

{
  ulong uVar1;
  undefined1 auVar2 [16];
  Error EVar3;
  ulong uVar4;
  ulong uVar5;
  bool bVar6;
  ulong uStack_8;
  
  EVar3 = 0;
  auVar2._8_8_ = 0;
  auVar2._0_8_ = sizeOfT;
  uVar4 = SUB168((ZEXT816(0) << 0x40 | ZEXT816(0x800000)) / auVar2,0);
  uVar5 = n + this->_length;
  if (CARRY8(n,this->_length)) {
    EVar3 = 1;
  }
  else {
    uVar1 = this->_capacity;
    if (uVar1 < uVar5) {
      if (uVar1 < 4) {
        uStack_8 = 4;
      }
      else if (uVar1 < 8) {
        uStack_8 = 8;
      }
      else if (uVar1 < 0x10) {
        uStack_8 = 0x10;
      }
      else if (uVar1 < 0x40) {
        uStack_8 = 0x40;
      }
      else {
        uStack_8 = 0x100;
        if (0x100 < uVar1) {
          uStack_8 = uVar1;
        }
      }
      while (uStack_8 < uVar5) {
        uVar1 = uStack_8 * 2;
        bVar6 = uStack_8 < uVar4;
        uStack_8 = uStack_8 + uVar4;
        if (bVar6) {
          uStack_8 = uVar1;
        }
      }
      EVar3 = _reserve(this,heap,sizeOfT,uStack_8);
      return EVar3;
    }
  }
  return EVar3;
}

Assistant:

Error ZoneVectorBase::_grow(ZoneHeap* heap, size_t sizeOfT, size_t n) noexcept {
  size_t threshold = Globals::kAllocThreshold / sizeOfT;
  size_t capacity = _capacity;
  size_t after = _length;

  if (ASMJIT_UNLIKELY(IntTraits<size_t>::maxValue() - n < after))
    return DebugUtils::errored(kErrorNoHeapMemory);

  after += n;
  if (capacity >= after)
    return kErrorOk;

  // ZoneVector is used as an array to hold short-lived data structures used
  // during code generation. The growing strategy is simple - use small capacity
  // at the beginning (very good for ZoneHeap) and then grow quicker to prevent
  // successive reallocations.
  if (capacity < 4)
    capacity = 4;
  else if (capacity < 8)
    capacity = 8;
  else if (capacity < 16)
    capacity = 16;
  else if (capacity < 64)
    capacity = 64;
  else if (capacity < 256)
    capacity = 256;

  while (capacity < after) {
    if (capacity < threshold)
      capacity *= 2;
    else
      capacity += threshold;
  }

  return _reserve(heap, sizeOfT, capacity);
}